

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SplitterBehavior
               (ImRect *bb,ImGuiID id,ImGuiAxis axis,float *size1,float *size2,float min_size1,
               float min_size2,float hover_extend,float hover_visibility_delay)

{
  bool bVar1;
  ImU32 flags;
  ImRect *in_RCX;
  int in_EDX;
  ImGuiID in_ESI;
  ImGuiMouseCursor cursor_type;
  ImVec2 *in_RDI;
  float *in_R8;
  float in_XMM0_Da;
  ImVec2 IVar2;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  ImU32 col;
  float size_2_maximum_delta;
  float size_1_maximum_delta;
  float mouse_delta;
  ImVec2 mouse_delta_2d;
  ImRect bb_render;
  ImRect bb_interact;
  bool held;
  bool hovered;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  float local_a0;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  float in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  float in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  ImVec2 local_64;
  ImRect local_5c;
  byte local_4a;
  byte local_49;
  ImGuiWindow *local_48;
  ImGuiContext *pIVar3;
  bool local_1;
  
  local_48 = GImGui->CurrentWindow;
  pIVar3 = GImGui;
  bVar1 = ItemAdd((ImRect *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                  (ImGuiID)in_stack_ffffffffffffff84,
                  (ImRect *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                  (ImGuiItemFlags)in_stack_ffffffffffffff74);
  if (bVar1) {
    local_5c.Min = *in_RDI;
    local_5c.Max = in_RDI[1];
    if (in_EDX == 1) {
      ImVec2::ImVec2(&local_64,0.0,in_XMM2_Da);
    }
    else {
      ImVec2::ImVec2(&local_64,in_XMM2_Da,0.0);
    }
    ImRect::Expand(&local_5c,&local_64);
    ButtonBehavior(in_RCX,(ImGuiID)((ulong)in_R8 >> 0x20),(bool *)CONCAT44(in_XMM0_Da,in_XMM1_Da),
                   (bool *)CONCAT44(in_XMM2_Da,in_XMM3_Da),(ImGuiButtonFlags)((ulong)pIVar3 >> 0x20)
                  );
    if ((local_49 & 1) != 0) {
      (pIVar3->LastItemData).StatusFlags = (pIVar3->LastItemData).StatusFlags | 1;
    }
    if (pIVar3->ActiveId != in_ESI) {
      SetItemAllowOverlap();
    }
    if (((local_4a & 1) != 0) ||
       ((((local_49 & 1) != 0 && (pIVar3->HoveredIdPreviousFrame == in_ESI)) &&
        (in_XMM3_Da <= pIVar3->HoveredIdTimer)))) {
      cursor_type = 4;
      if (in_EDX == 1) {
        cursor_type = 3;
      }
      SetMouseCursor(cursor_type);
    }
    if ((local_4a & 1) != 0) {
      IVar2 = ::operator-((ImVec2 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                          (ImVec2 *)0x500003);
      in_stack_ffffffffffffff7c = IVar2.x;
      in_stack_ffffffffffffff80 = IVar2.y;
      IVar2 = ::operator-((ImVec2 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                          (ImVec2 *)0x500018);
      in_stack_ffffffffffffff84 = IVar2.x;
      local_a0 = in_stack_ffffffffffffff84;
      if (in_EDX == 1) {
        local_a0 = IVar2.y;
      }
      in_stack_ffffffffffffff74 = ImMax<float>(0.0,(in_RCX->Min).x - in_XMM0_Da);
      in_stack_ffffffffffffff70 = ImMax<float>(0.0,*in_R8 - in_XMM1_Da);
      if (local_a0 < -in_stack_ffffffffffffff74) {
        local_a0 = -in_stack_ffffffffffffff74;
      }
      in_stack_ffffffffffffff78 = local_a0;
      if (in_stack_ffffffffffffff70 < local_a0) {
        in_stack_ffffffffffffff78 = in_stack_ffffffffffffff70;
      }
      if ((in_stack_ffffffffffffff78 != 0.0) || (NAN(in_stack_ffffffffffffff78))) {
        (in_RCX->Min).x = in_stack_ffffffffffffff78 + (in_RCX->Min).x;
        *in_R8 = *in_R8 - in_stack_ffffffffffffff78;
        if (in_EDX == 0) {
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff68,in_stack_ffffffffffffff78,0.0);
        }
        else {
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff68,0.0,in_stack_ffffffffffffff78);
        }
        ImRect::Translate((ImRect *)&stack0xffffffffffffff8c,(ImVec2 *)&stack0xffffffffffffff68);
        MarkItemEdited(in_ESI);
      }
    }
    flags = GetColorU32((ImGuiCol)in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
    ImDrawList::AddRectFilled
              ((ImDrawList *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (ImVec2 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               (ImVec2 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (ImU32)in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,flags);
    local_1 = (bool)(local_4a & 1);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::SplitterBehavior(const ImRect& bb, ImGuiID id, ImGuiAxis axis, float* size1, float* size2, float min_size1, float min_size2, float hover_extend, float hover_visibility_delay)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (!ItemAdd(bb, id, NULL, ImGuiItemFlags_NoNav))
        return false;

    bool hovered, held;
    ImRect bb_interact = bb;
    bb_interact.Expand(axis == ImGuiAxis_Y ? ImVec2(0.0f, hover_extend) : ImVec2(hover_extend, 0.0f));
    ButtonBehavior(bb_interact, id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_AllowItemOverlap);
    if (hovered)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredRect; // for IsItemHovered(), because bb_interact is larger than bb
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    if (held || (hovered && g.HoveredIdPreviousFrame == id && g.HoveredIdTimer >= hover_visibility_delay))
        SetMouseCursor(axis == ImGuiAxis_Y ? ImGuiMouseCursor_ResizeNS : ImGuiMouseCursor_ResizeEW);

    ImRect bb_render = bb;
    if (held)
    {
        ImVec2 mouse_delta_2d = g.IO.MousePos - g.ActiveIdClickOffset - bb_interact.Min;
        float mouse_delta = (axis == ImGuiAxis_Y) ? mouse_delta_2d.y : mouse_delta_2d.x;

        // Minimum pane size
        float size_1_maximum_delta = ImMax(0.0f, *size1 - min_size1);
        float size_2_maximum_delta = ImMax(0.0f, *size2 - min_size2);
        if (mouse_delta < -size_1_maximum_delta)
            mouse_delta = -size_1_maximum_delta;
        if (mouse_delta > size_2_maximum_delta)
            mouse_delta = size_2_maximum_delta;

        // Apply resize
        if (mouse_delta != 0.0f)
        {
            if (mouse_delta < 0.0f)
                IM_ASSERT(*size1 + mouse_delta >= min_size1);
            if (mouse_delta > 0.0f)
                IM_ASSERT(*size2 - mouse_delta >= min_size2);
            *size1 += mouse_delta;
            *size2 -= mouse_delta;
            bb_render.Translate((axis == ImGuiAxis_X) ? ImVec2(mouse_delta, 0.0f) : ImVec2(0.0f, mouse_delta));
            MarkItemEdited(id);
        }
    }

    // Render
    const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : (hovered && g.HoveredIdTimer >= hover_visibility_delay) ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
    window->DrawList->AddRectFilled(bb_render.Min, bb_render.Max, col, 0.0f);

    return held;
}